

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_quantize_avx.c
# Opt level: O0

void aom_quantize_b_32x32_avx
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i zero_00;
  __m128i zero_01;
  __m128i round_00;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i zero_02;
  __m128i zero_03;
  __m128i zero_04;
  __m128i zero_05;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i dequant_02;
  __m128i dequant_03;
  __m128i qcoeff;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int16_t iVar25;
  undefined1 (*in_RCX) [16];
  long lVar26;
  undefined1 (*in_RDX) [16];
  __m128i *in_RSI;
  tran_low_t *in_RDI;
  __m128i *coeff0_00;
  undefined8 *in_R8;
  __m128i *in_R9;
  longlong lVar27;
  undefined1 auVar28 [16];
  longlong lVar30;
  longlong lVar31;
  int *piVar32;
  undefined1 auVar29 [64];
  __m128i zbin_mask0;
  __m128i zbin_mask0_00;
  __m128i eob_00;
  __m128i round_01;
  __m128i round_02;
  __m128i round_03;
  __m128i quant_00;
  __m128i quant_01;
  __m128i quant_02;
  __m128i quant_03;
  __m128i zbin_mask1;
  __m128i zbin_mask1_00;
  undefined8 *in_stack_00000008;
  __m128i eob;
  __m128i all_zero;
  __m128i cmp_mask1;
  __m128i cmp_mask0;
  __m128i qcoeff1;
  __m128i qcoeff0;
  __m128i coeff1;
  __m128i coeff0;
  __m128i shift;
  __m128i dequant;
  __m128i quant;
  __m128i round;
  __m128i zbin;
  int log_scale;
  int index;
  __m256i big_zero;
  __m128i one;
  __m128i zero;
  int *in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7a8;
  longlong in_stack_fffffffffffff7b0;
  undefined1 *in_stack_fffffffffffff7b8;
  tran_low_t *in_stack_fffffffffffff7c0;
  undefined6 in_stack_fffffffffffff7c8;
  undefined2 uVar33;
  longlong in_stack_fffffffffffff7d0;
  undefined1 local_820 [16];
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  longlong local_7f0;
  longlong lVar34;
  tran_low_t *ptVar35;
  longlong lVar36;
  longlong lVar37;
  longlong lVar38;
  longlong lVar39;
  longlong lVar40;
  longlong lVar41;
  longlong lVar42;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  tran_low_t local_748;
  int local_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  __m128i *local_6e0;
  tran_low_t *local_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  longlong local_6a0;
  longlong lStack_698;
  longlong local_690;
  undefined8 uStack_688;
  longlong local_680;
  longlong lStack_678;
  longlong local_670;
  longlong lStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  longlong local_650;
  longlong lStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  longlong local_630;
  longlong lStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  longlong local_610;
  longlong lStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  longlong local_5f0;
  longlong lStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  longlong local_5c0;
  longlong lStack_5b8;
  longlong local_5b0;
  longlong lStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  longlong local_540;
  longlong lStack_538;
  longlong local_530;
  longlong lStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  longlong local_4b0;
  int *piStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  int *piStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 (*local_408) [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  tran_low_t *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  tran_low_t *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  tran_low_t *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 *local_248;
  longlong local_240;
  longlong lStack_238;
  longlong local_230;
  longlong lStack_228;
  longlong local_220;
  undefined8 uStack_218;
  longlong local_210;
  longlong lStack_208;
  longlong local_200;
  longlong lStack_1f8;
  longlong local_1f0;
  longlong lStack_1e8;
  longlong local_1e0;
  longlong lStack_1d8;
  longlong local_1d0;
  longlong lStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  longlong local_1b0;
  longlong lStack_1a8;
  longlong local_1a0;
  int *piStack_198;
  longlong local_190;
  longlong lStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  longlong local_170;
  longlong lStack_168;
  undefined8 local_160;
  int *piStack_158;
  longlong local_150;
  longlong lStack_148;
  longlong local_140;
  int *piStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined2 local_11a;
  tran_low_t *local_110;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50 [16];
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  
  local_6d0 = 0;
  uStack_6c8 = 0;
  local_710 = 0;
  uStack_708 = 0;
  local_11a = 1;
  uVar33 = 1;
  local_32 = 1;
  local_34 = 1;
  local_36 = 1;
  local_38 = 1;
  local_3a = 1;
  local_3c = 1;
  local_3e = 1;
  local_40 = 1;
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  local_50 = vpinsrw_avx(auVar1,1,7);
  local_720 = local_50._0_8_;
  uStack_718 = local_50._8_8_;
  local_6c0._8_8_ = SUB328(ZEXT832(0),4);
  local_740 = 0;
  uStack_738 = local_6c0._8_8_;
  uStack_730 = 0;
  uStack_728 = 0;
  local_748 = 1;
  local_820 = ZEXT816(0);
  local_c0 = *(undefined8 *)*in_RDX;
  uStack_b8 = *(undefined8 *)(*in_RDX + 8);
  local_d0 = local_50._0_8_;
  uStack_c8 = local_50._8_8_;
  auVar1 = vpaddw_avx(*in_RDX,local_50);
  local_760._0_8_ = auVar1._0_8_;
  local_760._8_8_ = auVar1._8_8_;
  local_80 = local_760._0_8_;
  uStack_78 = local_760._8_8_;
  local_84 = 1;
  auVar1 = vpsrlw_avx(auVar1,ZEXT416(1));
  local_760._0_8_ = auVar1._0_8_;
  local_760._8_8_ = auVar1._8_8_;
  local_60 = local_760._0_8_;
  uStack_58 = local_760._8_8_;
  local_70 = local_50._0_8_;
  uStack_68 = local_50._8_8_;
  local_760 = vpsubw_avx(auVar1,local_50);
  local_e0 = *(undefined8 *)*in_RCX;
  uStack_d8 = *(undefined8 *)(*in_RCX + 8);
  local_f0 = local_50._0_8_;
  uStack_e8 = local_50._8_8_;
  auVar1 = vpaddw_avx(*in_RCX,local_50);
  local_770._0_8_ = auVar1._0_8_;
  local_770._8_8_ = auVar1._8_8_;
  local_a0 = local_770._0_8_;
  uStack_98 = local_770._8_8_;
  local_a4 = 1;
  local_770 = vpsrlw_avx(auVar1,ZEXT416(1));
  local_780._0_8_ = *in_R8;
  local_780._8_8_ = in_R8[1];
  local_110 = dqcoeff_ptr;
  local_790._0_8_ = *(undefined8 *)dqcoeff_ptr;
  local_790._8_8_ = *(undefined8 *)(dqcoeff_ptr + 2);
  lVar27 = (*in_R9)[0];
  lVar30 = (*in_R9)[1];
  local_6e0 = in_RSI;
  local_6d8 = in_RDI;
  local_6c0 = ZEXT832(0) << 0x20;
  local_7a0._0_8_ = lVar27;
  local_7a0._8_8_ = lVar30;
  load_tran_low(in_RDI);
  coeff0_00 = (__m128i *)(local_6d8 + 8);
  lVar31 = lVar30;
  lVar42 = lVar27;
  load_tran_low((tran_low_t *)coeff0_00);
  auVar1._8_8_ = lVar30;
  auVar1._0_8_ = lVar42;
  auVar1 = vpabsw_avx(auVar1);
  lVar39 = auVar1._0_8_;
  lVar38 = auVar1._8_8_;
  auVar28._8_8_ = lVar31;
  auVar28._0_8_ = lVar27;
  auVar28 = vpabsw_avx(auVar28);
  lVar34 = auVar28._0_8_;
  lVar36 = auVar28._8_8_;
  local_600 = local_760._0_8_;
  uStack_5f8 = local_760._8_8_;
  auVar1 = vpcmpgtw_avx(auVar1,local_760);
  local_4d0 = local_760._0_8_;
  uStack_4c8 = local_760._8_8_;
  local_4e0 = local_760._0_8_;
  uStack_4d8 = local_760._8_8_;
  local_760 = vpunpckhqdq_avx(local_760,local_760);
  local_620 = local_760._0_8_;
  uStack_618 = local_760._8_8_;
  auVar28 = vpcmpgtw_avx(auVar28,local_760);
  local_7f0 = auVar1._0_8_;
  piVar32 = auVar1._8_8_;
  local_800 = auVar28._0_8_;
  uStack_7f8 = auVar28._8_8_;
  local_490 = local_7f0;
  local_4a0 = local_800;
  uStack_498 = uStack_7f8;
  auVar2 = vpor_avx(auVar1,auVar28);
  local_810 = auVar2._0_8_;
  uStack_808 = auVar2._8_8_;
  local_450 = local_810;
  uStack_448 = uStack_808;
  local_460 = local_810;
  uStack_458 = uStack_808;
  local_680 = lVar27;
  lStack_678 = lVar31;
  local_670 = lVar42;
  lStack_668 = lVar30;
  local_610 = lVar34;
  lStack_608 = lVar36;
  local_5f0 = lVar39;
  lStack_5e8 = lVar38;
  piStack_488 = piVar32;
  if (auVar2 == (undefined1  [16])0x0) {
    local_248 = in_stack_00000008;
    local_280 = local_740;
    uStack_278 = uStack_738;
    uStack_270 = uStack_730;
    uStack_268 = uStack_728;
    *in_stack_00000008 = local_740;
    in_stack_00000008[1] = uStack_738;
    in_stack_00000008[2] = uStack_730;
    in_stack_00000008[3] = uStack_728;
    local_288 = qcoeff_ptr;
    local_2c0 = local_740;
    uStack_2b8 = uStack_738;
    uStack_2b0 = uStack_730;
    uStack_2a8 = uStack_728;
    *(undefined8 *)qcoeff_ptr = local_740;
    *(undefined8 *)(qcoeff_ptr + 2) = uStack_738;
    *(undefined8 *)(qcoeff_ptr + 4) = uStack_730;
    *(undefined8 *)(qcoeff_ptr + 6) = uStack_728;
    local_2c8 = in_stack_00000008 + 4;
    local_300 = local_740;
    uStack_2f8 = uStack_738;
    uStack_2f0 = uStack_730;
    uStack_2e8 = uStack_728;
    *local_2c8 = local_740;
    in_stack_00000008[5] = uStack_738;
    in_stack_00000008[6] = uStack_730;
    in_stack_00000008[7] = uStack_728;
    local_308 = qcoeff_ptr + 8;
    local_340 = local_740;
    uStack_338 = uStack_738;
    uStack_330 = uStack_730;
    uStack_328 = uStack_728;
    *(undefined8 *)local_308 = local_740;
    *(undefined8 *)(qcoeff_ptr + 10) = uStack_738;
    *(undefined8 *)(qcoeff_ptr + 0xc) = uStack_730;
    *(undefined8 *)(qcoeff_ptr + 0xe) = uStack_728;
    local_4f0 = local_770._0_8_;
    uStack_4e8 = local_770._8_8_;
    local_500 = local_770._0_8_;
    uStack_4f8 = local_770._8_8_;
    local_770 = vpunpckhqdq_avx(local_770,local_770);
    local_510 = local_780._0_8_;
    uStack_508 = local_780._8_8_;
    local_520 = local_780._0_8_;
    uStack_518 = local_780._8_8_;
    auVar14._8_8_ = local_780._8_8_;
    auVar14._0_8_ = local_780._0_8_;
    auVar13._8_8_ = local_780._8_8_;
    auVar13._0_8_ = local_780._0_8_;
    local_780 = vpunpckhqdq_avx(auVar14,auVar13);
    local_530 = local_7a0._0_8_;
    lStack_528 = local_7a0._8_8_;
    local_540 = local_7a0._0_8_;
    lStack_538 = local_7a0._8_8_;
    auVar12._8_8_ = local_7a0._8_8_;
    auVar12._0_8_ = local_7a0._0_8_;
    auVar11._8_8_ = local_7a0._8_8_;
    auVar11._0_8_ = local_7a0._0_8_;
    local_7a0 = vpunpckhqdq_avx(auVar12,auVar11);
    local_550 = local_790._0_8_;
    uStack_548 = local_790._8_8_;
    local_560 = local_790._0_8_;
    uStack_558 = local_790._8_8_;
    auVar10._8_8_ = local_790._8_8_;
    auVar10._0_8_ = local_790._0_8_;
    auVar9._8_8_ = local_790._8_8_;
    auVar9._0_8_ = local_790._0_8_;
    local_790 = vpunpckhqdq_avx(auVar10,auVar9);
    auVar29 = ZEXT1664(local_790);
  }
  else {
    in_stack_fffffffffffff7b8 = local_7a0;
    in_stack_fffffffffffff7c0 = &local_748;
    round_01[1] = (longlong)in_stack_fffffffffffff7c0;
    round_01[0] = (longlong)in_stack_fffffffffffff7b8;
    quant_00[1] = (longlong)in_R8;
    quant_00[0] = (longlong)in_RCX;
    calculate_qcoeff_log_scale
              ((__m128i *)&stack0xfffffffffffff830,round_01,quant_00,in_R9,in_stack_fffffffffffff7a0
              );
    round_00[1] = (longlong)in_stack_fffffffffffff7c0;
    round_00[0] = (longlong)in_stack_fffffffffffff7b8;
    local_570 = local_770._0_8_;
    uStack_568 = local_770._8_8_;
    local_580 = local_770._0_8_;
    uStack_578 = local_770._8_8_;
    local_770 = vpunpckhqdq_avx(local_770,local_770);
    local_590 = local_780._0_8_;
    uStack_588 = local_780._8_8_;
    local_5a0 = local_780._0_8_;
    uStack_598 = local_780._8_8_;
    auVar8._8_8_ = local_780._8_8_;
    auVar8._0_8_ = local_780._0_8_;
    auVar7._8_8_ = local_780._8_8_;
    auVar7._0_8_ = local_780._0_8_;
    local_780 = vpunpckhqdq_avx(auVar8,auVar7);
    local_5b0 = local_7a0._0_8_;
    lStack_5a8 = local_7a0._8_8_;
    local_5c0 = local_7a0._0_8_;
    lStack_5b8 = local_7a0._8_8_;
    auVar6._8_8_ = local_7a0._8_8_;
    auVar6._0_8_ = local_7a0._0_8_;
    auVar5._8_8_ = local_7a0._8_8_;
    auVar5._0_8_ = local_7a0._0_8_;
    local_7a0 = vpunpckhqdq_avx(auVar6,auVar5);
    quant_01[1] = (longlong)in_R8;
    quant_01[0] = (longlong)in_RCX;
    calculate_qcoeff_log_scale
              ((__m128i *)&stack0xfffffffffffff820,round_00,quant_01,in_R9,in_stack_fffffffffffff7a0
              );
    auVar23._8_8_ = lVar38;
    auVar23._0_8_ = lVar39;
    auVar22._8_8_ = lVar30;
    auVar22._0_8_ = lVar42;
    auVar2 = vpsignw_avx(auVar23,auVar22);
    local_150 = auVar2._0_8_;
    lStack_148 = auVar2._8_8_;
    auVar21._8_8_ = lVar36;
    auVar21._0_8_ = lVar34;
    auVar20._8_8_ = lVar31;
    auVar20._0_8_ = lVar27;
    auVar3 = vpsignw_avx(auVar21,auVar20);
    local_170 = auVar3._0_8_;
    lStack_168 = auVar3._8_8_;
    local_160 = local_7f0;
    auVar2 = vpand_avx(auVar2,auVar1);
    lVar40 = auVar2._0_8_;
    lVar41 = auVar2._8_8_;
    local_180 = local_800;
    uStack_178 = uStack_7f8;
    auVar28 = vpand_avx(auVar3,auVar28);
    ptVar35 = auVar28._0_8_;
    lVar37 = auVar28._8_8_;
    a[0]._6_2_ = uVar33;
    a[0]._0_6_ = in_stack_fffffffffffff7c8;
    a[1] = in_stack_fffffffffffff7d0;
    local_200 = lVar27;
    lStack_1f8 = lVar31;
    local_1f0 = lVar34;
    lStack_1e8 = lVar36;
    local_1e0 = lVar42;
    lStack_1d8 = lVar30;
    local_1d0 = lVar39;
    lStack_1c8 = lVar38;
    piStack_158 = piVar32;
    store_tran_low(a,in_stack_fffffffffffff7c0);
    a_00[0]._6_2_ = uVar33;
    a_00[0]._0_6_ = in_stack_fffffffffffff7c8;
    a_00[1] = in_stack_fffffffffffff7d0;
    store_tran_low(a_00,in_stack_fffffffffffff7c0);
    qcoeff[1] = lVar42;
    qcoeff[0] = lVar31;
    dequant_00[1] = lVar27;
    dequant_00[0] = lVar41;
    zero_02[1] = lVar40;
    zero_02[0] = lVar37;
    calculate_dqcoeff_and_store_log_scale(qcoeff,dequant_00,zero_02,ptVar35,piVar32);
    local_5d0 = local_790._0_8_;
    uStack_5c8 = local_790._8_8_;
    local_5e0 = local_790._0_8_;
    uStack_5d8 = local_790._8_8_;
    auVar3._8_8_ = local_790._8_8_;
    auVar3._0_8_ = local_790._0_8_;
    auVar2._8_8_ = local_790._8_8_;
    auVar2._0_8_ = local_790._0_8_;
    local_790 = vpunpckhqdq_avx(auVar3,auVar2);
    qcoeff_00[1] = lVar42;
    qcoeff_00[0] = lVar31;
    dequant_01[1] = lVar27;
    dequant_01[0] = lVar41;
    zero_03[1] = lVar40;
    zero_03[0] = lVar37;
    calculate_dqcoeff_and_store_log_scale(qcoeff_00,dequant_01,zero_03,ptVar35,piVar32);
    auVar29 = ZEXT1664(auVar1);
    coeff0_00 = (__m128i *)&stack0xfffffffffffff830;
    in_RSI = (__m128i *)&stack0xfffffffffffff820;
    zero_00[1] = (longlong)in_stack_fffffffffffff7b8;
    zero_00[0] = in_stack_fffffffffffff7b0;
    zbin_mask0[1] = 0;
    zbin_mask0[0] = (longlong)scan;
    zbin_mask1[1] = (longlong)in_R9;
    zbin_mask1[0] = (longlong)in_R8;
    scan_for_eob(coeff0_00,in_RSI,zbin_mask0,zbin_mask1,(int16_t *)in_stack_fffffffffffff7a0,
                 in_stack_fffffffffffff7a8,zero_00);
    local_820 = auVar29._0_16_;
  }
  for (local_744 = 0x10; (long)local_744 < (long)local_6e0; local_744 = local_744 + 0x10) {
    auVar28 = auVar29._0_16_;
    load_tran_low(local_6d8 + local_744);
    lVar39 = auVar28._0_8_;
    uStack_7a8 = auVar28._8_8_;
    lVar26 = (long)local_744;
    coeff0_00 = (__m128i *)(local_6d8 + lVar26 + 8);
    load_tran_low((tran_low_t *)coeff0_00);
    lVar34 = auVar28._0_8_;
    lVar36 = auVar28._8_8_;
    uStack_688 = uStack_7a8;
    auVar4._8_8_ = uStack_7a8;
    auVar4._0_8_ = lVar39;
    auVar1 = vpabsw_avx(auVar4);
    lVar31 = auVar1._0_8_;
    lVar42 = auVar1._8_8_;
    auVar28 = vpabsw_avx(auVar28);
    lVar27 = auVar28._0_8_;
    lVar30 = auVar28._8_8_;
    local_640 = local_760._0_8_;
    uStack_638 = local_760._8_8_;
    auVar1 = vpcmpgtw_avx(auVar1,local_760);
    local_660 = local_760._0_8_;
    uStack_658 = local_760._8_8_;
    auVar28 = vpcmpgtw_avx(auVar28,local_760);
    local_7f0 = auVar1._0_8_;
    piVar32 = auVar1._8_8_;
    local_800 = auVar28._0_8_;
    uStack_7f8 = auVar28._8_8_;
    local_4b0 = local_7f0;
    local_4c0 = local_800;
    uStack_4b8 = uStack_7f8;
    auVar2 = vpor_avx(auVar1,auVar28);
    local_810 = auVar2._0_8_;
    uStack_808 = auVar2._8_8_;
    local_470 = local_810;
    uStack_468 = uStack_808;
    local_480 = local_810;
    uStack_478 = uStack_808;
    local_6a0 = lVar34;
    lStack_698 = lVar36;
    local_690 = lVar39;
    local_650 = lVar27;
    lStack_648 = lVar30;
    local_630 = lVar31;
    lStack_628 = lVar42;
    piStack_4a8 = piVar32;
    if (auVar2 == (undefined1  [16])0x0) {
      local_348 = (undefined8 *)((long)in_stack_00000008 + (long)local_744 * 4);
      local_380 = local_740;
      uStack_378 = uStack_738;
      uStack_370 = uStack_730;
      uStack_368 = uStack_728;
      *local_348 = local_740;
      local_348[1] = uStack_738;
      local_348[2] = uStack_730;
      local_348[3] = uStack_728;
      local_388 = qcoeff_ptr + local_744;
      local_3c0 = local_740;
      uStack_3b8 = uStack_738;
      uStack_3b0 = uStack_730;
      uStack_3a8 = uStack_728;
      *(undefined8 *)local_388 = local_740;
      *(undefined8 *)(local_388 + 2) = uStack_738;
      *(undefined8 *)(local_388 + 4) = uStack_730;
      *(undefined8 *)(local_388 + 6) = uStack_728;
      local_3c8 = (undefined8 *)((long)in_stack_00000008 + (long)local_744 * 4 + 0x20);
      local_400 = local_740;
      uStack_3f8 = uStack_738;
      uStack_3f0 = uStack_730;
      uStack_3e8 = uStack_728;
      *local_3c8 = local_740;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_744 * 4 + 0x28) = uStack_738;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_744 * 4 + 0x30) = uStack_730;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_744 * 4 + 0x38) = uStack_728;
      local_408 = (undefined1 (*) [32])(qcoeff_ptr + (long)local_744 + 8);
      local_440 = local_740;
      uStack_438 = uStack_738;
      uStack_430 = uStack_730;
      uStack_428 = uStack_728;
      auVar15._8_8_ = uStack_738;
      auVar15._0_8_ = local_740;
      auVar15._16_8_ = uStack_730;
      auVar15._24_8_ = uStack_728;
      auVar29 = ZEXT3264(auVar15);
      *local_408 = auVar15;
      local_7f0 = in_stack_fffffffffffff7d0;
    }
    else {
      round_02[1] = (longlong)&local_748;
      round_02[0] = (longlong)local_7a0;
      quant_02[1] = (longlong)in_R8;
      quant_02[0] = lVar26;
      calculate_qcoeff_log_scale
                ((__m128i *)&stack0xfffffffffffff830,round_02,quant_02,in_R9,
                 in_stack_fffffffffffff7a0);
      round_03[1] = (longlong)&local_748;
      round_03[0] = (longlong)local_7a0;
      quant_03[1] = (longlong)in_R8;
      quant_03[0] = lVar26;
      calculate_qcoeff_log_scale
                ((__m128i *)&stack0xfffffffffffff820,round_03,quant_03,in_R9,
                 in_stack_fffffffffffff7a0);
      uStack_218 = uStack_7a8;
      auVar19._8_8_ = lVar42;
      auVar19._0_8_ = lVar31;
      auVar18._8_8_ = uStack_7a8;
      auVar18._0_8_ = lVar39;
      auVar2 = vpsignw_avx(auVar19,auVar18);
      local_190 = auVar2._0_8_;
      lStack_188 = auVar2._8_8_;
      auVar17._8_8_ = lVar30;
      auVar17._0_8_ = lVar27;
      auVar16._8_8_ = lVar36;
      auVar16._0_8_ = lVar34;
      auVar3 = vpsignw_avx(auVar17,auVar16);
      local_1b0 = auVar3._0_8_;
      lStack_1a8 = auVar3._8_8_;
      local_1a0 = local_7f0;
      auVar1 = vpand_avx(auVar2,auVar1);
      lVar37 = auVar1._0_8_;
      lVar40 = auVar1._8_8_;
      local_1c0 = local_800;
      uStack_1b8 = uStack_7f8;
      auVar1 = vpand_avx(auVar3,auVar28);
      ptVar35 = auVar1._0_8_;
      lVar38 = auVar1._8_8_;
      a_01[0]._6_2_ = uVar33;
      a_01[0]._0_6_ = in_stack_fffffffffffff7c8;
      a_01[1] = in_stack_fffffffffffff7d0;
      local_240 = lVar34;
      lStack_238 = lVar36;
      local_230 = lVar27;
      lStack_228 = lVar30;
      local_220 = lVar39;
      local_210 = lVar31;
      lStack_208 = lVar42;
      piStack_198 = piVar32;
      store_tran_low(a_01,in_stack_fffffffffffff7c0);
      a_02[0]._6_2_ = uVar33;
      a_02[0]._0_6_ = in_stack_fffffffffffff7c8;
      a_02[1] = in_stack_fffffffffffff7d0;
      store_tran_low(a_02,in_stack_fffffffffffff7c0);
      qcoeff_01[1] = lVar39;
      qcoeff_01[0] = lVar36;
      dequant_02[1] = lVar34;
      dequant_02[0] = lVar40;
      zero_04[1] = lVar37;
      zero_04[0] = lVar38;
      calculate_dqcoeff_and_store_log_scale(qcoeff_01,dequant_02,zero_04,ptVar35,piVar32);
      qcoeff_02[1] = lVar39;
      qcoeff_02[0] = lVar36;
      dequant_03[1] = lVar34;
      dequant_03[0] = lVar40;
      zero_05[1] = lVar37;
      zero_05[0] = lVar38;
      calculate_dqcoeff_and_store_log_scale(qcoeff_02,dequant_03,zero_05,ptVar35,piVar32);
      coeff0_00 = (__m128i *)&stack0xfffffffffffff830;
      in_RSI = (__m128i *)&stack0xfffffffffffff820;
      zero_01[1] = (longlong)in_stack_fffffffffffff7b8;
      zero_01[0] = in_stack_fffffffffffff7b0;
      zbin_mask0_00[1]._0_4_ = local_744;
      zbin_mask0_00[0] = (longlong)scan;
      zbin_mask0_00[1]._4_4_ = 0;
      zbin_mask1_00[1] = (longlong)in_R9;
      zbin_mask1_00[0] = (longlong)in_R8;
      scan_for_eob(coeff0_00,in_RSI,zbin_mask0_00,zbin_mask1_00,(int16_t *)in_stack_fffffffffffff7a0
                   ,in_stack_fffffffffffff7a8,zero_01);
      local_130 = local_820._0_8_;
      uStack_128 = local_820._8_8_;
      auVar24._8_8_ = piVar32;
      auVar24._0_8_ = local_7f0;
      local_820 = vpmaxsw_avx(local_820,auVar24);
      auVar29 = ZEXT1664(local_820);
      local_140 = local_7f0;
      piStack_138 = piVar32;
    }
    in_stack_fffffffffffff7d0 = local_7f0;
  }
  eob_00[1] = (longlong)in_RSI;
  eob_00[0] = (longlong)coeff0_00;
  iVar25 = accumulate_eob(eob_00);
  *dequant_ptr = iVar25;
  return;
}

Assistant:

void aom_quantize_b_32x32_avx(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                              const int16_t *zbin_ptr, const int16_t *round_ptr,
                              const int16_t *quant_ptr,
                              const int16_t *quant_shift_ptr,
                              tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                              const int16_t *dequant_ptr, uint16_t *eob_ptr,
                              const int16_t *scan, const int16_t *iscan) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m256i big_zero = _mm256_setzero_si256();
  int index;
  const int log_scale = 1;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i eob = zero, eob0;

  (void)scan;

  // Setup global values.
  // The 32x32 halves zbin and round.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, one);
  zbin = _mm_srli_epi16(zbin, 1);
  // x86 has no "greater *or equal*" comparison. Subtract 1 from zbin so
  // it is a strict "greater" comparison.
  zbin = _mm_sub_epi16(zbin, one);

  round = _mm_load_si128((const __m128i *)round_ptr);
  round = _mm_add_epi16(round, one);
  round = _mm_srli_epi16(round, 1);

  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Do DC and first 15 AC.
  coeff0 = load_tran_low(coeff_ptr);
  coeff1 = load_tran_low(coeff_ptr + 8);

  qcoeff0 = _mm_abs_epi16(coeff0);
  qcoeff1 = _mm_abs_epi16(coeff1);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC.
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_test_all_zeros(all_zero, all_zero)) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), big_zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    // Reinsert signs.
    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    // Mask out zbin threshold coeffs.
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr);
    store_tran_low(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero, dqcoeff_ptr,
                                          &log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + 8, &log_scale);

    eob =
        scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, 0, zero);
  }

  // AC only loop.
  for (index = 16; index < n_coeffs; index += 16) {
    coeff0 = load_tran_low(coeff_ptr + index);
    coeff1 = load_tran_low(coeff_ptr + index + 8);

    qcoeff0 = _mm_abs_epi16(coeff0);
    qcoeff1 = _mm_abs_epi16(coeff1);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_test_all_zeros(all_zero, all_zero)) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), big_zero);
      continue;
    }

    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr + index);
    store_tran_low(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero,
                                          dqcoeff_ptr + index, &log_scale);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + index + 8, &log_scale);

    eob0 = scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, index,
                        zero);
    eob = _mm_max_epi16(eob, eob0);
  }

  *eob_ptr = accumulate_eob(eob);
}